

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void Memory::
     DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListCounted<Loop::MemOpCandidate*,Memory::ArenaAllocator>>
               (AllocatorType *allocator,
               SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator> *obj)

{
  SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::~SList
            (&obj->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>);
  (obj->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)allocator->bvFreeList;
  allocator->bvFreeList = (BVSparseNode *)obj;
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}